

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void map_print_key(EditLine *el,el_action_t *map,wchar_t *in)

{
  el_bindings_t *peVar1;
  size_t sVar2;
  el_bindings_t *peVar3;
  char outbuf [1024];
  char acStack_418 [1024];
  
  if ((*in != L'\0') && (in[1] != L'\0')) {
    keymacro_print(el,in);
    return;
  }
  keymacro__decode_str(in,acStack_418,0x400,"");
  sVar2 = (el->el_map).nfunc;
  if (0 < (long)sVar2) {
    peVar3 = (el->el_map).help;
    peVar1 = peVar3 + sVar2;
    do {
      if (peVar3->func == (uint)map[(byte)*in]) {
        fprintf((FILE *)el->el_outfile,"%s\t->\t%ls\n",acStack_418,peVar3->name);
        return;
      }
      peVar3 = peVar3 + 1;
    } while (peVar3 < peVar1);
  }
  return;
}

Assistant:

static void
map_print_key(EditLine *el, el_action_t *map, const wchar_t *in)
{
	char outbuf[EL_BUFSIZ];
	el_bindings_t *bp, *ep;

	if (in[0] == '\0' || in[1] == '\0') {
		(void) keymacro__decode_str(in, outbuf, sizeof(outbuf), "");
		ep = &el->el_map.help[el->el_map.nfunc];
		for (bp = el->el_map.help; bp < ep; bp++)
			if (bp->func == map[(unsigned char) *in]) {
				(void) fprintf(el->el_outfile,
				    "%s\t->\t%ls\n", outbuf, bp->name);
				return;
			}
	} else
		keymacro_print(el, in);
}